

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test::
~LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test
          (LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test *this)

{
  void *in_RDI;
  
  ~LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test
            ((LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test *)0x1cb5a8);
  operator_delete(in_RDI,0x98);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForBoundedVarAndRangeRow) {
  lp.add_column(ColType::Bounded, -1.0, 5);
  lp.add_row(RowType::Range, -3, 7);
  lp.add_value(0, 0, 2.0);
  lp.add_logicals();

  check_feasible(true, {{0, 7}, {-1, 9}, {3.5, 0}});
  check_feasible(false, {{-1.5, 0}, {4, 0}});
}